

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

char * jsonnet::internal::Token::toString(Kind v)

{
  ostream *this;
  void *this_00;
  int in_EDI;
  char *local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = "\"{\"";
    break;
  case 1:
    local_8 = "\"}\"";
    break;
  case 2:
    local_8 = "\"[\"";
    break;
  case 3:
    local_8 = "\"]\"";
    break;
  case 4:
    local_8 = "\",\"";
    break;
  case 5:
    local_8 = "\"$\"";
    break;
  case 6:
    local_8 = "\".\"";
    break;
  case 7:
    local_8 = "\"(\"";
    break;
  case 8:
    local_8 = "\")\"";
    break;
  case 9:
    local_8 = "\";\"";
    break;
  case 10:
    local_8 = "IDENTIFIER";
    break;
  case 0xb:
    local_8 = "NUMBER";
    break;
  case 0xc:
    local_8 = "OPERATOR";
    break;
  case 0xd:
    local_8 = "STRING_DOUBLE";
    break;
  case 0xe:
    local_8 = "STRING_SINGLE";
    break;
  case 0xf:
    local_8 = "STRING_BLOCK";
    break;
  case 0x10:
    local_8 = "VERBATIM_STRING_SINGLE";
    break;
  case 0x11:
    local_8 = "VERBATIM_STRING_DOUBLE";
    break;
  case 0x12:
    local_8 = "assert";
    break;
  case 0x13:
    local_8 = "else";
    break;
  case 0x14:
    local_8 = "error";
    break;
  case 0x15:
    local_8 = "false";
    break;
  case 0x16:
    local_8 = "for";
    break;
  case 0x17:
    local_8 = "function";
    break;
  case 0x18:
    local_8 = "if";
    break;
  case 0x19:
    local_8 = "import";
    break;
  case 0x1a:
    local_8 = "importstr";
    break;
  case 0x1b:
    local_8 = "importbin";
    break;
  case 0x1c:
    local_8 = "in";
    break;
  case 0x1d:
    local_8 = "local";
    break;
  case 0x1e:
    local_8 = "null";
    break;
  case 0x1f:
    local_8 = "tailstrict";
    break;
  case 0x20:
    local_8 = "then";
    break;
  case 0x21:
    local_8 = "self";
    break;
  case 0x22:
    local_8 = "super";
    break;
  case 0x23:
    local_8 = "true";
    break;
  case 0x24:
    local_8 = "end of file";
    break;
  default:
    this = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown token kind: ");
    this_00 = (void *)std::ostream::operator<<(this,in_EDI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    abort();
  }
  return local_8;
}

Assistant:

static const char *toString(Kind v)
    {
        switch (v) {
            case BRACE_L: return "\"{\"";
            case BRACE_R: return "\"}\"";
            case BRACKET_L: return "\"[\"";
            case BRACKET_R: return "\"]\"";
            case COMMA: return "\",\"";
            case DOLLAR: return "\"$\"";
            case DOT: return "\".\"";

            case PAREN_L: return "\"(\"";
            case PAREN_R: return "\")\"";
            case SEMICOLON: return "\";\"";

            case IDENTIFIER: return "IDENTIFIER";
            case NUMBER: return "NUMBER";
            case OPERATOR: return "OPERATOR";
            case STRING_SINGLE: return "STRING_SINGLE";
            case STRING_DOUBLE: return "STRING_DOUBLE";
            case VERBATIM_STRING_SINGLE: return "VERBATIM_STRING_SINGLE";
            case VERBATIM_STRING_DOUBLE: return "VERBATIM_STRING_DOUBLE";
            case STRING_BLOCK: return "STRING_BLOCK";

            case ASSERT: return "assert";
            case ELSE: return "else";
            case ERROR: return "error";
            case FALSE: return "false";
            case FOR: return "for";
            case FUNCTION: return "function";
            case IF: return "if";
            case IMPORT: return "import";
            case IMPORTSTR: return "importstr";
            case IMPORTBIN: return "importbin";
            case IN: return "in";
            case LOCAL: return "local";
            case NULL_LIT: return "null";
            case SELF: return "self";
            case SUPER: return "super";
            case TAILSTRICT: return "tailstrict";
            case THEN: return "then";
            case TRUE: return "true";

            case END_OF_FILE: return "end of file";
            default:
                std::cerr << "INTERNAL ERROR: Unknown token kind: " << v << std::endl;
                std::abort();
        }
    }